

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Namespace * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,Namespace *n)

{
  ModuleBase *pMVar1;
  Namespace *pNVar2;
  
  pMVar1 = (this->currentModule).object;
  (this->currentModule).object = &n->super_ModuleBase;
  pNVar2 = ModuleInstanceResolver::visitModule<soul::AST::Namespace>
                     (&this->super_ModuleInstanceResolver,n);
  (this->currentModule).object = pMVar1;
  return pNVar2;
}

Assistant:

AST::Namespace& visit (AST::Namespace& n) override
        {
            auto lastModule = currentModule;
            currentModule = n;
            auto& result = ModuleInstanceResolver::visit (n);
            currentModule = lastModule;
            return result;
        }